

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  int *piVar1;
  int iVar2;
  byte bVar3;
  bool bVar4;
  Curl_easy *pCVar5;
  curl_hash *sh;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  Curl_sh_entry *pCVar10;
  void *pvVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  size_t __n;
  Curl_easy *data_local;
  curl_hash *local_80;
  uint local_78;
  int local_74;
  Curl_multi *local_70;
  curl_socket_t socks [5];
  int actions [5];
  
  for (lVar12 = 0; lVar12 != 5; lVar12 = lVar12 + 1) {
    socks[lVar12] = -1;
  }
  data_local = data;
  uVar7 = multi_getsock(data,socks);
  local_80 = &multi->sockhash;
  local_70 = multi;
  for (lVar12 = 0; sh = local_80, lVar12 != 5; lVar12 = lVar12 + 1) {
    uVar15 = (uint)lVar12;
    bVar3 = (byte)lVar12;
    if ((uVar7 >> (bVar3 & 0x1f) & 0x10001) == 0) goto LAB_001286c9;
    uVar14 = 0x10000 << (bVar3 & 0x1f);
    uVar17 = 1 << (bVar3 & 0x1f);
    iVar2 = socks[lVar12];
    pCVar10 = sh_getentry(local_80,iVar2);
    uVar15 = (uint)((uVar7 >> (uVar15 & 0x1f) & 1) != 0);
    uVar9 = uVar15 + 2;
    if ((uVar14 & uVar7) == 0) {
      uVar9 = uVar15;
    }
    actions[lVar12] = uVar9;
    if (pCVar10 == (Curl_sh_entry *)0x0) {
      local_74 = iVar2;
      pCVar10 = sh_getentry(sh,iVar2);
      if (pCVar10 == (Curl_sh_entry *)0x0) {
        pCVar10 = (Curl_sh_entry *)(*Curl_ccalloc)(1,0x50);
        if (pCVar10 == (Curl_sh_entry *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        iVar8 = Curl_hash_init((curl_hash *)pCVar10,0xd,trhash,trhash_compare,trhash_dtor);
        if (iVar8 != 0) {
LAB_001287d1:
          (*Curl_cfree)(pCVar10);
          return CURLM_OUT_OF_MEMORY;
        }
        pvVar11 = Curl_hash_add(local_80,&local_74,4,pCVar10);
        if (pvVar11 == (void *)0x0) {
          Curl_hash_destroy((curl_hash *)pCVar10);
          goto LAB_001287d1;
        }
      }
LAB_0012863c:
      pCVar10->users = pCVar10->users + 1;
      if ((uVar17 & uVar7) != 0) {
        pCVar10->readers = pCVar10->readers + 1;
      }
      if ((uVar14 & uVar7) != 0) {
        pCVar10->writers = pCVar10->writers + 1;
      }
      pvVar11 = Curl_hash_add(&pCVar10->transfers,&data_local,8,data_local);
      if (pvVar11 == (void *)0x0) {
        return CURLM_OUT_OF_MEMORY;
      }
      bVar4 = false;
    }
    else {
      uVar13 = (ulong)(uint)data_local->numsocks;
      if (data_local->numsocks < 1) {
        uVar13 = 0;
      }
      uVar6 = 0;
      do {
        uVar16 = uVar6;
        if (uVar13 == uVar16) goto LAB_0012863c;
        uVar6 = uVar16 + 1;
      } while (iVar2 != data_local->sockets[uVar16]);
      uVar15 = data_local->actions[uVar16];
      bVar4 = true;
      if (uVar15 != uVar9) {
        if ((uVar15 & 1) != 0) {
          pCVar10->readers = pCVar10->readers - 1;
        }
        if ((uVar15 & 2) != 0) {
          pCVar10->writers = pCVar10->writers - 1;
        }
        if ((uVar17 & uVar7) != 0) {
          pCVar10->readers = pCVar10->readers + 1;
        }
        if ((uVar14 & uVar7) != 0) {
          pCVar10->writers = pCVar10->writers + 1;
        }
      }
    }
    uVar15 = (uint)(pCVar10->readers != 0) + (uint)(pCVar10->writers != 0) * 2;
    if ((!bVar4) || (pCVar10->action != uVar15)) {
      if (local_70->socket_cb != (curl_socket_callback)0x0) {
        (*local_70->socket_cb)(data_local,iVar2,uVar15,local_70->socket_userp,pCVar10->socketp);
      }
      pCVar10->action = uVar15;
    }
  }
  uVar15 = 5;
LAB_001286c9:
  lVar12 = 0;
  local_78 = uVar15;
  do {
    pCVar5 = data_local;
    if (data_local->numsocks <= lVar12) {
      __n = (ulong)uVar15 << 2;
      memcpy(data_local->sockets,socks,__n);
      memcpy(pCVar5->actions,actions,__n);
      pCVar5->numsocks = local_78;
      return CURLM_OK;
    }
    iVar2 = data_local->sockets[lVar12];
    uVar13 = 0;
    do {
      if (uVar15 == uVar13) {
        pCVar10 = sh_getentry(local_80,iVar2);
        if (pCVar10 != (Curl_sh_entry *)0x0) {
          uVar7 = data_local->actions[lVar12];
          uVar9 = pCVar10->users - 1;
          pCVar10->users = uVar9;
          if ((uVar7 & 2) != 0) {
            pCVar10->writers = pCVar10->writers - 1;
          }
          if ((uVar7 & 1) != 0) {
            pCVar10->readers = pCVar10->readers - 1;
          }
          if (uVar9 == 0) {
            if (local_70->socket_cb != (curl_socket_callback)0x0) {
              (*local_70->socket_cb)(data_local,iVar2,4,local_70->socket_userp,pCVar10->socketp);
            }
            sh_delentry(pCVar10,local_80,iVar2);
          }
          else {
            Curl_hash_delete(&pCVar10->transfers,&data_local,8);
          }
        }
        break;
      }
      piVar1 = socks + uVar13;
      uVar13 = uVar13 + 1;
    } while (iVar2 != *piVar1);
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  int actions[MAX_SOCKSPEREASYHANDLE];

  for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    unsigned int action = CURL_POLL_NONE;
    unsigned int prevaction = 0;
    unsigned int comboaction;
    bool sincebefore = FALSE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    actions[i] = action;
    if(entry) {
      /* check if new for this transfer */
      int j;
      for(j = 0; j< data->numsocks; j++) {
        if(s == data->sockets[j]) {
          prevaction = data->actions[j];
          sincebefore = TRUE;
          break;
        }
      }
    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(sincebefore && (prevaction != action)) {
      /* Socket was used already, but different action now */
      if(prevaction & CURL_POLL_IN)
        entry->readers--;
      if(prevaction & CURL_POLL_OUT)
        entry->writers--;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!sincebefore) {
      /* a new user */
      entry->users++;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data))
        return CURLM_OUT_OF_MEMORY;
    }

    comboaction = (entry->writers? CURL_POLL_OUT : 0) |
      (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(sincebefore && (entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb)
      multi->socket_cb(data, s, comboaction, multi->socket_userp,
                       entry->socketp);

    entry->action = comboaction; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i = 0; i< data->numsocks; i++) {
    int j;
    bool stillused = FALSE;
    s = data->sockets[i];
    for(j = 0; j < num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      int oldactions = data->actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb)
          multi->socket_cb(data, s, CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(entry, &multi->sockhash, s);
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  memcpy(data->actions, actions, num*sizeof(int));
  data->numsocks = num;
  return CURLM_OK;
}